

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Buffer.cxx
# Opt level: O1

char * __thiscall Fl_Text_Buffer::selection_text_(Fl_Text_Buffer *this,Fl_Text_Selection *sel)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  int in_EDX;
  size_t sVar4;
  int iVar5;
  char *pcVar6;
  Fl_Text_Selection *pFVar7;
  int iVar8;
  int iVar9;
  size_t sVar10;
  
  pFVar7 = sel;
  if (sel->mSelected == true) {
    pFVar7 = (Fl_Text_Selection *)(ulong)(uint)sel->mStart;
    in_EDX = sel->mEnd;
  }
  if (sel->mSelected != false) {
    iVar5 = (int)pFVar7;
    if ((iVar5 < 0) || (iVar1 = this->mLength, iVar1 < iVar5)) {
      pcVar2 = (char *)malloc(1);
      pcVar3 = pcVar2;
    }
    else {
      iVar8 = iVar5;
      if (iVar5 < in_EDX) {
        iVar8 = in_EDX;
      }
      if (in_EDX < iVar5) {
        iVar5 = in_EDX;
      }
      if (iVar1 <= iVar8) {
        iVar8 = iVar1;
      }
      iVar9 = iVar8 - iVar5;
      pcVar3 = (char *)malloc((long)(iVar9 + 1));
      iVar1 = this->mGapStart;
      sVar10 = (size_t)iVar9;
      sVar4 = sVar10;
      pcVar2 = pcVar3;
      if (iVar1 < iVar8) {
        if (iVar5 < iVar1) {
          iVar1 = iVar1 - iVar5;
          pcVar6 = this->mBuf;
          memcpy(pcVar3,pcVar6 + iVar5,(long)iVar1);
          pcVar6 = pcVar6 + this->mGapEnd;
          sVar4 = (long)(iVar9 - iVar1);
          pcVar2 = pcVar3 + iVar1;
        }
        else {
          pcVar6 = this->mBuf + ((long)this->mGapEnd - (long)iVar1) + (long)iVar5;
        }
      }
      else {
        pcVar6 = this->mBuf + iVar5;
      }
      memcpy(pcVar2,pcVar6,sVar4);
      pcVar2 = pcVar3 + sVar10;
    }
    *pcVar2 = '\0';
    return pcVar3;
  }
  pcVar3 = (char *)malloc(1);
  *pcVar3 = '\0';
  return pcVar3;
}

Assistant:

char *Fl_Text_Buffer::selection_text_(Fl_Text_Selection * sel) const {
  int start, end;
  
  /* If there's no selection, return an allocated empty string */
  if (!sel->position(&start, &end))
  {
    char *s = (char *) malloc(1);
    *s = '\0';
    return s;
  }
  
  /* Return the selected range */
    return text_range(start, end);
}